

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int mp_fprint_ext_test(FILE *file,char **data,int depth)

{
  char *local_38;
  char *ext;
  char local_25;
  uint32_t len;
  int8_t type;
  char **ppcStack_20;
  int depth_local;
  char **data_local;
  FILE *file_local;
  
  len = depth;
  ppcStack_20 = data;
  data_local = (char **)file;
  ext._4_4_ = mp_decode_extl(data,&local_25);
  local_38 = *ppcStack_20;
  *ppcStack_20 = *ppcStack_20 + ext._4_4_;
  if (local_25 == '\0') {
    file_local._4_4_ = fprintf((FILE *)data_local,"%.*s",(ulong)ext._4_4_,local_38);
  }
  else if (local_25 == '\x01') {
    file_local._4_4_ = mp_fprint_recursion((FILE *)data_local,&local_38,len);
  }
  else {
    file_local._4_4_ = fprintf((FILE *)data_local,"undefined");
  }
  return file_local._4_4_;
}

Assistant:

static int
mp_fprint_ext_test(FILE *file, const char **data, int depth)
{
	int8_t type;
	uint32_t len = mp_decode_extl(data, &type);
	const char *ext = *data;
	*data += len;
	switch(type) {
	case MP_EXT_TEST_PLAIN:
		return fprintf(file, "%.*s", len, ext);
	case MP_EXT_TEST_MSGPACK:
		return mp_fprint_recursion(file, &ext, depth);
	}
	return fprintf(file, "undefined");
}